

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sspm.cpp
# Opt level: O3

void __thiscall pg::SSPMSolver::run(SSPMSolver *this,int n_bits,int depth,int player)

{
  ulong *puVar1;
  uint target;
  uint64_t *puVar2;
  byte bVar3;
  char cVar4;
  bool bVar5;
  uint uVar6;
  ulong uVar7;
  int *piVar8;
  ulong uVar9;
  ostream *poVar10;
  long *plVar11;
  ulong uVar12;
  Game *pGVar13;
  long lVar14;
  uint *puVar15;
  char *pcVar16;
  int iVar17;
  int from;
  long lVar18;
  size_t sVar19;
  ulong uVar20;
  int s;
  int s_1;
  _label_vertex local_48;
  int local_34;
  
  this->l = n_bits;
  this->h = depth;
  bitset::resize(&this->pm_b,(long)n_bits * ((this->super_Solver).game)->n_vertices);
  iVar17 = this->l;
  uVar7 = ((this->super_Solver).game)->n_vertices * (long)iVar17;
  piVar8 = (int *)operator_new__(-(ulong)(uVar7 >> 0x3e != 0) | uVar7 * 4);
  this->pm_d = piVar8;
  bitset::resize(&this->tmp_b,(long)iVar17);
  sVar19 = (size_t)this->l;
  uVar7 = sVar19 * 4;
  if ((long)sVar19 < 0) {
    uVar7 = 0xffffffffffffffff;
  }
  piVar8 = (int *)operator_new__(uVar7);
  this->tmp_d = piVar8;
  bitset::resize(&this->best_b,sVar19);
  sVar19 = (size_t)this->l;
  uVar7 = sVar19 * 4;
  if ((long)sVar19 < 0) {
    uVar7 = 0xffffffffffffffff;
  }
  piVar8 = (int *)operator_new__(uVar7);
  this->best_d = piVar8;
  bitset::resize(&this->test_b,sVar19);
  uVar7 = (long)this->l * 4;
  uVar20 = 0xffffffffffffffff;
  if (-1 < (long)this->l) {
    uVar20 = uVar7;
  }
  piVar8 = (int *)operator_new__(uVar20);
  this->test_d = piVar8;
  memset(this->pm_d,0,uVar7 * ((this->super_Solver).game)->n_vertices);
  uVar6 = (int)((this->super_Solver).game)->n_vertices - 1;
  if (-1 < (int)uVar6) {
    uVar7 = (ulong)uVar6;
    do {
      if ((((this->super_Solver).disabled)->_bits[uVar7 >> 6] >> (uVar7 & 0x3f) & 1) == 0) {
        this->lift_attempt = this->lift_attempt + 1;
        bVar5 = lift(this,(int)uVar7,-1,(int *)&local_48,player);
        if (bVar5) {
          this->lift_count = this->lift_count + 1;
          pGVar13 = (this->super_Solver).game;
          piVar8 = pGVar13->_inedges;
          lVar14 = (long)pGVar13->_firstins[uVar7];
          uVar6 = piVar8[lVar14];
          if (uVar6 != 0xffffffff) {
            puVar15 = (uint *)(piVar8 + lVar14 + 1);
            do {
              uVar20 = (ulong)(long)(int)uVar6 >> 6;
              if ((((this->super_Solver).disabled)->_bits[uVar20] >> ((ulong)uVar6 & 0x3f) & 1) == 0
                 ) {
                this->lift_attempt = this->lift_attempt + 1;
                bVar5 = lift(this,uVar6,(int)uVar7,&local_34,player);
                if (bVar5) {
                  this->lift_count = this->lift_count + 1;
                  puVar2 = (this->dirty)._bits;
                  uVar9 = 1L << ((ulong)uVar6 & 0x3f);
                  uVar12 = puVar2[uVar20];
                  if ((uVar12 & uVar9) == 0) {
                    iVar17 = (this->Q).pointer;
                    (this->Q).pointer = iVar17 + 1;
                    (this->Q).queue[iVar17] = uVar6;
                    puVar2[uVar20] = uVar12 | uVar9;
                    if (1 < (this->super_Solver).trace) {
                      poVar10 = (this->super_Solver).logger;
                      std::__ostream_insert<char,std::char_traits<char>>(poVar10,"push(",5);
                      poVar10 = (ostream *)std::ostream::operator<<(poVar10,uVar6);
                      std::__ostream_insert<char,std::char_traits<char>>(poVar10,")",1);
                      std::ios::widen((char)poVar10->_vptr_basic_ostream[-3] + (char)poVar10);
                      std::ostream::put((char)poVar10);
                      std::ostream::flush();
                    }
                  }
                }
              }
              uVar6 = *puVar15;
              puVar15 = puVar15 + 1;
            } while (uVar6 != 0xffffffff);
          }
        }
      }
      bVar5 = 0 < (long)uVar7;
      uVar7 = uVar7 - 1;
    } while (bVar5);
  }
  iVar17 = (this->Q).pointer;
  if (iVar17 != 0) {
    do {
      (this->Q).pointer = iVar17 + -1;
      target = (this->Q).queue[(long)iVar17 + -1];
      bVar3 = (byte)target & 0x3f;
      puVar1 = (this->dirty)._bits + ((ulong)(long)(int)target >> 6);
      *puVar1 = *puVar1 & (-2L << bVar3 | 0xfffffffffffffffeU >> 0x40 - bVar3);
      if (1 < (this->super_Solver).trace) {
        poVar10 = (this->super_Solver).logger;
        std::__ostream_insert<char,std::char_traits<char>>(poVar10,"pop() => ",9);
        plVar11 = (long *)std::ostream::operator<<(poVar10,target);
        std::ios::widen((char)*(undefined8 *)(*plVar11 + -0x18) + (char)plVar11);
        std::ostream::put((char)plVar11);
        std::ostream::flush();
      }
      pGVar13 = (this->super_Solver).game;
      piVar8 = pGVar13->_inedges;
      lVar14 = (long)pGVar13->_firstins[(int)target];
      uVar6 = piVar8[lVar14];
      if (uVar6 != 0xffffffff) {
        puVar15 = (uint *)(piVar8 + lVar14 + 1);
        do {
          uVar7 = (ulong)(long)(int)uVar6 >> 6;
          if ((((this->super_Solver).disabled)->_bits[uVar7] >> ((ulong)uVar6 & 0x3f) & 1) == 0) {
            this->lift_attempt = this->lift_attempt + 1;
            bVar5 = lift(this,uVar6,target,(int *)&local_48,player);
            if (bVar5) {
              this->lift_count = this->lift_count + 1;
              puVar2 = (this->dirty)._bits;
              uVar12 = 1L << ((ulong)uVar6 & 0x3f);
              uVar20 = puVar2[uVar7];
              if ((uVar20 & uVar12) == 0) {
                iVar17 = (this->Q).pointer;
                (this->Q).pointer = iVar17 + 1;
                (this->Q).queue[iVar17] = uVar6;
                puVar2[uVar7] = uVar20 | uVar12;
                if (1 < (this->super_Solver).trace) {
                  poVar10 = (this->super_Solver).logger;
                  std::__ostream_insert<char,std::char_traits<char>>(poVar10,"push(",5);
                  poVar10 = (ostream *)std::ostream::operator<<(poVar10,uVar6);
                  std::__ostream_insert<char,std::char_traits<char>>(poVar10,")",1);
                  std::ios::widen((char)poVar10->_vptr_basic_ostream[-3] + (char)poVar10);
                  std::ostream::put((char)poVar10);
                  std::ostream::flush();
                }
              }
            }
          }
          uVar6 = *puVar15;
          puVar15 = puVar15 + 1;
        } while (uVar6 != 0xffffffff);
      }
      iVar17 = (this->Q).pointer;
    } while (iVar17 != 0);
  }
  pGVar13 = (this->super_Solver).game;
  lVar14 = pGVar13->n_vertices;
  if (0 < lVar14) {
    lVar18 = 0;
    uVar7 = 0;
    do {
      if (((((((this->super_Solver).disabled)->_bits[uVar7 >> 6] >> (uVar7 & 0x3f) & 1) == 0) &&
           (iVar17 = (int)uVar7, this->pm_d[(long)iVar17 * (long)this->l] != -1)) &&
          ((uint)(((pGVar13->_owner)._bits[uVar7 >> 6] & 1L << (uVar7 & 0x3f)) != 0) != player)) &&
         (bVar5 = lift(this,iVar17,-1,(int *)((long)pGVar13->strategy + lVar18),player), bVar5)) {
        poVar10 = (this->super_Solver).logger;
        std::__ostream_insert<char,std::char_traits<char>>(poVar10,"error: ",7);
        poVar10 = (ostream *)std::ostream::operator<<(poVar10,iVar17);
        std::__ostream_insert<char,std::char_traits<char>>(poVar10," is not progressive!",0x14);
        std::ios::widen((char)poVar10->_vptr_basic_ostream[-3] + (char)poVar10);
        std::ostream::put((char)poVar10);
        std::ostream::flush();
      }
      pGVar13 = (this->super_Solver).game;
      uVar7 = uVar7 + 1;
      lVar18 = lVar18 + 4;
      lVar14 = pGVar13->n_vertices;
    } while ((long)uVar7 < lVar14);
  }
  if ((this->super_Solver).trace != 0) {
    if (lVar14 < 1) goto LAB_0016f48f;
    uVar7 = 0;
    do {
      uVar20 = uVar7 >> 6;
      if ((((this->super_Solver).disabled)->_bits[uVar20] >> (uVar7 & 0x3f) & 1) == 0) {
        poVar10 = (this->super_Solver).logger;
        uVar12 = 1L << (uVar7 & 0x3f);
        std::__ostream_insert<char,std::char_traits<char>>(poVar10,"\x1b[1m",4);
        local_48.g = (this->super_Solver).game;
        iVar17 = (int)uVar7;
        local_48.v = iVar17;
        poVar10 = operator<<(poVar10,&local_48);
        pcVar16 = " (odd)";
        bVar5 = ((((this->super_Solver).game)->_owner)._bits[uVar20] & uVar12) == 0;
        if (bVar5) {
          pcVar16 = " (even)";
        }
        std::__ostream_insert<char,std::char_traits<char>>(poVar10,pcVar16,(ulong)bVar5 | 6);
        std::__ostream_insert<char,std::char_traits<char>>(poVar10,"\x1b[m:",4);
        stream_pm(this,(this->super_Solver).logger,iVar17);
        if ((this->pm_d[(long)iVar17 * (long)this->l] != -1) &&
           ((uint)(((((this->super_Solver).game)->_owner)._bits[uVar20] & uVar12) != 0) != player))
        {
          poVar10 = (this->super_Solver).logger;
          std::__ostream_insert<char,std::char_traits<char>>(poVar10," => ",4);
          local_48.g = (this->super_Solver).game;
          local_48.v = (local_48.g)->strategy[uVar7];
          operator<<(poVar10,&local_48);
        }
        poVar10 = (this->super_Solver).logger;
        cVar4 = (char)poVar10;
        std::ios::widen((char)poVar10->_vptr_basic_ostream[-3] + cVar4);
        std::ostream::put(cVar4);
        std::ostream::flush();
        pGVar13 = (this->super_Solver).game;
        lVar14 = pGVar13->n_vertices;
      }
      uVar7 = uVar7 + 1;
    } while ((long)uVar7 < lVar14);
  }
  if (0 < lVar14) {
    uVar7 = 0;
    do {
      if (((((this->super_Solver).disabled)->_bits[uVar7 >> 6] >> (uVar7 & 0x3f) & 1) == 0) &&
         (this->pm_d[(long)(int)uVar7 * (long)this->l] != -1)) {
        Oink::solve((this->super_Solver).oink,(int)uVar7,1 - player,pGVar13->strategy[uVar7]);
        pGVar13 = (this->super_Solver).game;
        lVar14 = pGVar13->n_vertices;
      }
      uVar7 = uVar7 + 1;
    } while ((long)uVar7 < lVar14);
  }
LAB_0016f48f:
  Oink::flush((this->super_Solver).oink);
  if (this->pm_d != (int *)0x0) {
    operator_delete__(this->pm_d);
  }
  if (this->tmp_d != (int *)0x0) {
    operator_delete__(this->tmp_d);
  }
  if (this->best_d != (int *)0x0) {
    operator_delete__(this->best_d);
  }
  if (this->test_d != (int *)0x0) {
    operator_delete__(this->test_d);
  }
  return;
}

Assistant:

void
SSPMSolver::run(int n_bits, int depth, int player)
{
    l = n_bits;
    h = depth;

    pm_b.resize(l*nodecount());
    pm_d = new int[l*nodecount()];

    tmp_b.resize(l);
    tmp_d = new int[l];

    best_b.resize(l);
    best_d = new int[l];

    test_b.resize(l);
    test_d = new int[l];

    // initialize progress measures
    // pm_b.reset(); // standard set to 0 already
    memset(pm_d, 0, sizeof(int[l*nodecount()])); // every bit in the top ( = min )

    // lift_counters = new uint64_t[nodecount()];
    // memset(lift_counters, 0, sizeof(uint64_t[nodecount()]));

    for (int n=nodecount()-1; n>=0; n--) {
        if (disabled[n]) continue;
        lift_attempt++;
        int s;
        if (lift(n, -1, s, player)) {
            lift_count++;
            // lift_counters[n]++;
            for (auto curedge = ins(n); *curedge != -1; curedge++) {
                int from = *curedge;
                if (disabled[from]) continue;
                lift_attempt++;
                int s;
                if (lift(from, n, s, player)) {
                    lift_count++;
                    // lift_counters[from]++;
                    todo_push(from);
                }
            }
        }
    }

    while (!Q.empty()) {
        int n = todo_pop();
        for (auto curedge = ins(n); *curedge != -1; curedge++) {
            int from = *curedge;
            if (disabled[from]) continue;
            lift_attempt++;
            int s;
            if (lift(from, n, s, player)) {
                lift_count++;
                // lift_counters[from]++;
                todo_push(from);
            }
        }
    }

    /**
     * Derive strategies.
     */

    for (int v=0; v<nodecount(); v++) {
        if (disabled[v]) continue;
        if (pm_d[l*v] != -1) {
            if (owner(v) != player) {
                // TODO: don't rely on the strategy array in the Game class
                if (lift(v, -1, game.getStrategy()[v], player)) logger << "error: " << v << " is not progressive!" << std::endl;
            }
        }
    }

    if (trace) {
        for (int v=0; v<nodecount(); v++) {
            if (disabled[v]) continue;

            logger << "\033[1m" << label_vertex(v) << (owner(v)?" (odd)":" (even)") << "\033[m:";
            stream_pm(logger, v);

            if (pm_d[l*v] != -1) {
                if (owner(v) != player) {
                    logger << " => " << label_vertex(game.getStrategy(v));
                }
            }

            logger << std::endl;
        }
    }

    /**
     * Mark solved.
     */

    for (int v=0; v<nodecount(); v++) {
        if (disabled[v]) continue;
        if (pm_d[l*v] != -1) Solver::solve(v, 1-player, game.getStrategy(v));
    }

    Solver::flush();

    /*
    {
        uint64_t hi_c = 0;
        int hi_n = -1;
        for (int i=0; i<nodecount(); i++) {
            if (hi_c < lift_counters[i]) {
                hi_c = lift_counters[i];
                hi_n = i;
            }
        }
        logger << "highest counter: " << hi_c << " lifts for vertex " << label_vertex(hi_n) << std::endl;
    }
    */

    delete[] pm_d;
    delete[] tmp_d;
    delete[] best_d;
    delete[] test_d;
}